

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::ViewportArray::DepthRangeAPI::iterate(DepthRangeAPI *this)

{
  bool bVar1;
  NotSupportedError *this_00;
  RenderContext *pRVar2;
  TestContext *pTVar3;
  ApiType local_2c;
  ApiType *local_28;
  ContextType *context_type;
  bool test_result;
  DepthRangeAPI *local_10;
  DepthRangeAPI *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_viewport_array_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Viewport array functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0x857);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  local_2c.m_bits = (*pRVar2->_vptr_RenderContext[2])();
  local_28 = &local_2c;
  bVar1 = glu::isContextTypeGLCore((ContextType)local_2c.m_bits);
  if (bVar1) {
    context_type._3_1_ = iterateHelper<double>(this,(double *)0x0);
  }
  else {
    context_type._3_1_ = iterateHelper<float>(this,(float *)0x0);
  }
  if ((bool)context_type._3_1_ == true) {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCaseBase).m_context);
    tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCaseBase).m_context);
    tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DepthRangeAPI::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	bool					test_result;
	const glu::ContextType& context_type = m_context.getRenderContext().getType();

	if (glu::isContextTypeGLCore(context_type))
	{
		test_result = iterateHelper<GLdouble>();
	}
	else
	{
		DE_ASSERT(glu::isContextTypeES(context_type));
		test_result = iterateHelper<GLfloat>();
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}